

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  const_reference value;
  size_t sVar5;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar6;
  reference pFVar7;
  uint32_t *puVar8;
  string *value_00;
  FileDescriptorProto *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range3_1;
  FileDescriptorProto *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *__range3;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  CodeGeneratorRequest *this_;
  CodeGeneratorRequest *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar4 = _internal_file_to_generate_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  _i = protobuf::internal::FromIntSize(iVar3);
  local_60 = 0;
  pRVar4 = _internal_file_to_generate_abi_cxx11_(this);
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar4);
  for (; local_60 < iVar3; local_60 = local_60 + 1) {
    pRVar4 = _internal_file_to_generate_abi_cxx11_(this);
    value = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get(pRVar4,local_60);
    sVar5 = protobuf::internal::WireFormatLite::StringSize(value);
    _i = sVar5 + _i;
  }
  iVar3 = _internal_proto_file_size(this);
  _i = (long)iVar3 + _i;
  pRVar6 = _internal_proto_file(this);
  __end3 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(pRVar6);
  msg = (FileDescriptorProto *)RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(pRVar6);
  while (bVar2 = protobuf::internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    pFVar7 = protobuf::internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::
             operator*(&__end3);
    sVar5 = protobuf::internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      (pFVar7);
    _i = sVar5 + _i;
    protobuf::internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator++
              (&__end3);
  }
  iVar3 = _internal_source_file_descriptors_size(this);
  _i = (long)iVar3 * 2 + _i;
  pRVar6 = _internal_source_file_descriptors(this);
  __end3_1 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::begin(pRVar6);
  msg_1 = (FileDescriptorProto *)
          RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(pRVar6);
  while (bVar2 = protobuf::internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    pFVar7 = protobuf::internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::
             operator*(&__end3_1);
    sVar5 = protobuf::internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      (pFVar7);
    _i = sVar5 + _i;
    protobuf::internal::RepeatedPtrIterator<const_google::protobuf::FileDescriptorProto>::operator++
              (&__end3_1);
  }
  puVar8 = protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_parameter_abi_cxx11_(this);
      sVar5 = protobuf::internal::WireFormatLite::StringSize(value_00);
      _i = sVar5 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = protobuf::internal::WireFormatLite::MessageSize<google::protobuf::compiler::Version>
                        ((this->field_0)._impl_.compiler_version_);
      _i = sVar5 + 1 + _i;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t CodeGeneratorRequest::ByteSizeLong() const {
  const CodeGeneratorRequest& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string file_to_generate = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_file_to_generate().size());
      for (int i = 0, n = this_._internal_file_to_generate().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_file_to_generate().Get(i));
      }
    }
    // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
    {
      total_size += 1UL * this_._internal_proto_file_size();
      for (const auto& msg : this_._internal_proto_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.FileDescriptorProto source_file_descriptors = 17;
    {
      total_size += 2UL * this_._internal_source_file_descriptors_size();
      for (const auto& msg : this_._internal_source_file_descriptors()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string parameter = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_parameter());
    }
    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.compiler_version_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}